

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  TargetType tgtType;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  cmMakefile *pcVar2;
  bool bVar3;
  int iVar4;
  cmMessenger *messenger;
  ostream *poVar5;
  ostringstream e;
  char *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_72_2_0a0279e7_for_Entry_0 local_198;
  ios_base local_138 [264];
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  tgtType = (_Var1._M_head_impl)->TargetType;
  local_1d0 = value;
  messenger = cmMakefile::GetMessenger((_Var1._M_head_impl)->Makefile);
  cmMakefile::GetBacktrace
            (((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
  bVar3 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)local_1a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  if (!bVar3) {
    return;
  }
  iVar4 = std::__cxx11::string::compare((char *)prop);
  if (iVar4 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"NAME property is read-only\n",0x1b);
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)prop);
    if ((iVar4 == 0) &&
       (((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == true))
    {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"EXPORT_NAME property can\'t be set on imported targets (\"",
                 0x38);
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                          *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
      pcVar2 = ((this->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)prop);
      if ((iVar4 == 0) &&
         (((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == true
         )) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"SOURCES property can\'t be set on imported targets (\"",
                   0x34);
        _Var1._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                            *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
        pcVar2 = ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)prop);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare((char *)prop);
          if (iVar4 == 0) {
            if (local_1d0 == (char *)0x0) {
              return;
            }
            if (*local_1d0 == '\0') {
              return;
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        IncludeDirectoriesEntries,&local_1d0);
            cmMakefile::GetBacktrace
                      (((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                      (&((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        IncludeDirectoriesBacktraces,(value_type *)local_1a8);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)prop);
            if (iVar4 == 0) {
              if (local_1d0 == (char *)0x0) {
                return;
              }
              if (*local_1d0 == '\0') {
                return;
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          CompileOptionsEntries,&local_1d0);
              cmMakefile::GetBacktrace
                        (((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                        );
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          CompileOptionsBacktraces,(value_type *)local_1a8);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)prop);
              if (iVar4 == 0) {
                if (local_1d0 == (char *)0x0) {
                  return;
                }
                if (*local_1d0 == '\0') {
                  return;
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const*&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            CompileFeaturesEntries,&local_1d0);
                cmMakefile::GetBacktrace
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Makefile);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            CompileFeaturesBacktraces,(value_type *)local_1a8);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)prop);
                if (iVar4 == 0) {
                  if (local_1d0 == (char *)0x0) {
                    return;
                  }
                  if (*local_1d0 == '\0') {
                    return;
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              CompileDefinitionsEntries,&local_1d0);
                  cmMakefile::GetBacktrace
                            (((this->impl)._M_t.
                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                              .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             Makefile);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              CompileDefinitionsBacktraces,(value_type *)local_1a8);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)prop);
                  if (iVar4 == 0) {
                    if (local_1d0 == (char *)0x0) {
                      return;
                    }
                    if (*local_1d0 == '\0') {
                      return;
                    }
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                LinkOptionsEntries,&local_1d0);
                    cmMakefile::GetBacktrace
                              (((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               Makefile);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               LinkOptionsBacktraces,(value_type *)local_1a8);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)prop);
                    if (iVar4 == 0) {
                      if (local_1d0 == (char *)0x0) {
                        return;
                      }
                      if (*local_1d0 == '\0') {
                        return;
                      }
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->LinkDirectoriesEntries,&local_1d0);
                      cmMakefile::GetBacktrace
                                (((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Makefile);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 LinkDirectoriesBacktraces,(value_type *)local_1a8);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)prop);
                      if (iVar4 == 0) {
                        if (local_1d0 == (char *)0x0) {
                          return;
                        }
                        if (*local_1d0 == '\0') {
                          return;
                        }
                        cmMakefile::GetBacktrace
                                  (((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->Makefile);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->LinkImplementationPropertyEntries,&local_1d0);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->LinkImplementationPropertyBacktraces,(value_type *)local_1a8);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)prop);
                        if (iVar4 != 0) {
                          iVar4 = strncmp((prop->_M_dataplus)._M_p,"IMPORTED_LIBNAME",0x10);
                          _Var1._M_head_impl =
                               (this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                          if (iVar4 != 0) {
                            cmPropertyMap::AppendProperty
                                      (&(_Var1._M_head_impl)->Properties,prop,local_1d0,asString);
                            return;
                          }
                          pcVar2 = (_Var1._M_head_impl)->Makefile;
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1a8,prop," property may not be APPENDed.");
                          cmMakefile::IssueMessage
                                    (pcVar2,FATAL_ERROR,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a8);
                          if ((anon_union_72_2_0a0279e7_for_Entry_0 *)local_1a8._0_8_ == &local_198)
                          {
                            return;
                          }
                          operator_delete((void *)local_1a8._0_8_,
                                          (ulong)&((local_198.Bottom.State)->PropertyDefinitions).
                                                  _M_t._M_impl.field_0x1);
                          return;
                        }
                        cmMakefile::GetBacktrace
                                  (((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->Makefile);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->SourceEntries,&local_1d0);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->SourceBacktraces,(value_type *)local_1a8);
                      }
                    }
                  }
                }
              }
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
          return;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "IMPORTED_GLOBAL property can\'t be appended, only set on imported targets (\"",
                   0x4b);
        _Var1._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                            *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
        pcVar2 = ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, impl->Makefile->GetMessenger(),
        impl->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << impl->Name
      << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "IMPORTED_GLOBAL") {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be appended, only set on imported "
         "targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (value && *value) {
      impl->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (value && *value) {
      impl->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (value && *value) {
      impl->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (value && *value) {
      impl->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_OPTIONS") {
    if (value && *value) {
      impl->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_DIRECTORIES") {
    if (value && *value) {
      impl->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (value && *value) {
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkImplementationPropertyEntries.emplace_back(value);
      impl->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
    impl->SourceEntries.emplace_back(value);
    impl->SourceBacktraces.push_back(lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 prop + " property may not be APPENDed.");
  } else {
    impl->Properties.AppendProperty(prop, value, asString);
  }
}